

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnTable
          (BinaryReaderIR *this,Index index,Type elem_type,Limits *elem_limits)

{
  char *__s;
  Offset OVar1;
  uint64_t uVar2;
  bool bVar3;
  size_t sVar4;
  pointer *__ptr;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> field;
  Location loc;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_58;
  TableModuleField *local_50;
  Location local_48;
  
  local_48.field_1.field_0.line = 0;
  local_48.field_1.field_0.first_column = 0;
  local_48.field_1.field_0.last_column = 0;
  local_48.filename.data_ = (char *)0x0;
  local_48.filename.size_._0_4_ = 0;
  local_48.filename.size_._4_4_ = 0;
  __s = this->filename_;
  sVar4 = strlen(__s);
  local_48.filename.size_._0_4_ = (undefined4)sVar4;
  local_48.filename.size_._4_4_ = (undefined4)(sVar4 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_48.field_1.field_0.line = (int)OVar1;
  local_48.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
  local_48.filename.data_ = __s;
  MakeUnique<wabt::TableModuleField,wabt::Location>((wabt *)&local_50,&local_48);
  bVar3 = elem_limits->is_shared;
  (local_50->table).elem_limits.has_max = elem_limits->has_max;
  (local_50->table).elem_limits.is_shared = bVar3;
  uVar2 = elem_limits->max;
  (local_50->table).elem_limits.initial = elem_limits->initial;
  (local_50->table).elem_limits.max = uVar2;
  (local_50->table).elem_type.enum_ = elem_type.enum_;
  local_58._M_head_impl = local_50;
  local_50 = (TableModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                       *)&local_58);
  if (local_58._M_head_impl != (TableModuleField *)0x0) {
    (*((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_58._M_head_impl = (TableModuleField *)0x0;
  if (local_50 != (TableModuleField *)0x0) {
    (**(code **)(*(long *)local_50 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnTable(Index index,
                               Type elem_type,
                               const Limits* elem_limits) {
  auto field = MakeUnique<TableModuleField>(GetLocation());
  Table& table = field->table;
  table.elem_limits = *elem_limits;
  table.elem_type = elem_type;
  module_->AppendField(std::move(field));
  return Result::Ok;
}